

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_oarchive.h
# Opt level: O2

void __thiscall serialization::xml_oarchive::~xml_oarchive(xml_oarchive *this)

{
  std::__cxx11::string::~string((string *)&this->str_);
  rapidxml::memory_pool<char>::~memory_pool(&(this->document_).super_memory_pool<char>);
  return;
}

Assistant:

xml_oarchive()
    {
    }